

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O3

void __thiscall crnlib::spinlock::lock(spinlock *this)

{
  int iVar1;
  
  iVar1 = pthread_spin_lock(&this->m_spinlock);
  if (iVar1 != 0) {
    crnlib_fail("\"spinlock: pthread_spin_lock() failed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_threading_pthreads.cpp"
                ,0xd9);
    return;
  }
  return;
}

Assistant:

void spinlock::lock() {
#if !defined(__APPLE__)
  if (pthread_spin_lock(&m_spinlock)) {
    CRNLIB_FAIL("spinlock: pthread_spin_lock() failed");
  }
#else
  os_unfair_lock_lock(m_lock);
#endif
}